

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

string * __thiscall
CLI::detail::
generate_set<std::map<int,std::unique_ptr<double,std::default_delete<double>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<double,std::default_delete<double>>>>>>
          (string *__return_storage_ptr__,detail *this,
          map<int,_std::unique_ptr<double,_std::default_delete<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<double,_std::default_delete<double>_>_>_>_>
          *set)

{
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,",","");
  join<std::map<int,std::unique_ptr<double,std::default_delete<double>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<double,std::default_delete<double>>>>>,CLI::detail::generate_set<std::map<int,std::unique_ptr<double,std::default_delete<double>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<double,std::default_delete<double>>>>>>(std::map<int,std::unique_ptr<double,std::default_delete<double>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<double,std::default_delete<double>>>>>const&)::_lambda(std::pair<int_const,std::unique_ptr<double,std::default_delete<double>>>const&)_1_,void>
            (local_40,this,local_60);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_set(const T &set) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(set),
        [](const iteration_type_t &v) { return detail::pair_adaptor<element_t>::first(v); },
        ","));
    out.push_back('}');
    return out;
}